

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

int __thiscall poll(void *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  int *private_data;
  int i;
  undefined4 local_c;
  
  uVar1 = *(ulong *)((long)this + 0x20);
  local_c = 0;
  uVar3 = uVar1;
  while ((int)local_c < 3) {
    _Var2 = key_down(*(int *)(uVar1 + (long)(int)local_c * 4));
    if (_Var2) {
      *(undefined4 *)((long)this + (long)(int)local_c * 4) = 1;
    }
    else {
      *(undefined4 *)((long)this + (long)(int)local_c * 4) = 0;
    }
    local_c = local_c + 1;
    uVar3 = (ulong)local_c;
  }
  return (int)uVar3;
}

Assistant:

static void poll(VCONTROLLER * this)
{
   int i;

   int *private_data = (int *)(this->private_data);

   for (i = 0; i < 3; i++) {
      if (key_down(private_data[i])) {
         this->button[i] = 1;
      } else {
         this->button[i] = 0;
      }
   }
}